

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_boreal_wind(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  float fVar1;
  bool bVar2;
  int idam;
  
  if (ch->in_room->sector_type == 8) {
    send_to_char("You cannot cast this spell underwater.\n\r",ch);
    return;
  }
  idam = dice(level,5);
  switch(ch->in_room->area->temp) {
  case 0:
    fVar1 = (float)idam * 0.25;
    break;
  case 1:
    fVar1 = (float)idam * 0.75;
    break;
  case 2:
    fVar1 = (float)idam * 1.25;
    break;
  case 3:
    fVar1 = (float)idam * 1.75;
    break;
  default:
    goto switchD_0035f844_default;
  }
  idam = (int)fVar1;
switchD_0035f844_default:
  act("You gesture at $N, sending a bitter blast of frigid air towards $M!",ch,(void *)0x0,vo,3);
  act("$n gestures at you, sending a bitter blast of frigid air towards you!",ch,(void *)0x0,vo,2);
  act("$n gestures at $N, sending a bitter blast of frigid air towards $M!",ch,(void *)0x0,vo,1);
  bVar2 = saves_spell(level,(CHAR_DATA *)vo,5);
  if (bVar2) {
    idam = idam / 2;
  }
  damage_new(ch,(CHAR_DATA *)vo,idam,sn,5,true,false,0,1,(char *)0x0);
  return;
}

Assistant:

void spell_boreal_wind(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	if (ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this spell underwater.\n\r", ch);
		return;
	}

	dam = dice(level, 5);

	switch (ch->in_room->area->temp)
	{
		case Temperature::Hot:
			dam = (int)((float)dam * 0.25);
			break;
		case Temperature::Warm:
			dam = (int)((float)dam * 0.75);
			break;
		case Temperature::Cool:
			dam = (int)((float)dam * 1.25);
			break;
		case Temperature::Cold:
			dam = (int)((float)dam * 1.75);
			break;
		default:
			break;
	}

	act("You gesture at $N, sending a bitter blast of frigid air towards $M!", ch, nullptr, victim, TO_CHAR);
	act("$n gestures at you, sending a bitter blast of frigid air towards you!", ch, nullptr, victim, TO_VICT);
	act("$n gestures at $N, sending a bitter blast of frigid air towards $M!", ch, nullptr, victim, TO_NOTVICT);

	if (saves_spell(level, victim, DAM_COLD))
		dam /= 2;

	damage_new(ch, victim, dam, sn, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
}